

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

char * nk_utf_at(char *buffer,int length,int index,nk_rune *unicode,int *len)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  if (buffer == (char *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x1f22,"const char *nk_utf_at(const char *, int, int, nk_rune *, int *)");
  }
  if (unicode == (nk_rune *)0x0) {
    __assert_fail("unicode",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x1f23,"const char *nk_utf_at(const char *, int, int, nk_rune *, int *)");
  }
  if (len == (int *)0x0) {
    __assert_fail("len",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x1f24,"const char *nk_utf_at(const char *, int, int, nk_rune *, int *)");
  }
  if (index < 0) {
    *unicode = 0xfffd;
    *len = 0;
  }
  else {
    iVar1 = nk_utf_decode(buffer,unicode,length);
    if (iVar1 == 0) {
      iVar3 = 0;
      iVar2 = 0;
    }
    else {
      iVar2 = 0;
      iVar3 = 0;
      do {
        if (index == iVar2) {
          *len = iVar1;
          iVar2 = index;
          break;
        }
        iVar2 = iVar2 + 1;
        iVar3 = iVar3 + iVar1;
        iVar1 = nk_utf_decode(buffer + iVar3,unicode,length - iVar3);
      } while (iVar1 != 0);
    }
    if (iVar2 == index) {
      return buffer + iVar3;
    }
  }
  return (char *)0x0;
}

Assistant:

NK_API const char*
nk_utf_at(const char *buffer, int length, int index,
    nk_rune *unicode, int *len)
{
    int i = 0;
    int src_len = 0;
    int glyph_len = 0;
    const char *text;
    int text_len;

    NK_ASSERT(buffer);
    NK_ASSERT(unicode);
    NK_ASSERT(len);

    if (!buffer || !unicode || !len) return 0;
    if (index < 0) {
        *unicode = NK_UTF_INVALID;
        *len = 0;
        return 0;
    }

    text = buffer;
    text_len = length;
    glyph_len = nk_utf_decode(text, unicode, text_len);
    while (glyph_len) {
        if (i == index) {
            *len = glyph_len;
            break;
        }

        i++;
        src_len = src_len + glyph_len;
        glyph_len = nk_utf_decode(text + src_len, unicode, text_len - src_len);
    }
    if (i != index) return 0;
    return buffer + src_len;
}